

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O0

int luaZ_fill(ZIO *z)

{
  lua_State *plVar1;
  byte *pbVar2;
  int iVar3;
  char *pcVar4;
  char *buff;
  lua_State *L;
  size_t size;
  ZIO *z_local;
  
  plVar1 = z->L;
  iVar3 = **(int **)&plVar1[-1].hookmask + -1;
  **(int **)&plVar1[-1].hookmask = iVar3;
  size = (size_t)z;
  if (iVar3 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lzio.c"
                  ,0x1b,"int luaZ_fill(ZIO *)");
  }
  pcVar4 = (*z->reader)(plVar1,z->data,(size_t *)&L);
  iVar3 = **(int **)&plVar1[-1].hookmask;
  **(int **)&plVar1[-1].hookmask = iVar3 + 1;
  if (iVar3 == 0) {
    if ((pcVar4 == (char *)0x0) || (L == (lua_State *)0x0)) {
      z_local._4_4_ = 0xffffffff;
    }
    else {
      *(undefined1 **)size = &L[-1].field_0xcf;
      *(char **)(size + 8) = pcVar4;
      pbVar2 = *(byte **)(size + 8);
      *(byte **)(size + 8) = pbVar2 + 1;
      z_local._4_4_ = (uint)*pbVar2;
    }
    return z_local._4_4_;
  }
  __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lzio.c"
                ,0x1d,"int luaZ_fill(ZIO *)");
}

Assistant:

int luaZ_fill (ZIO *z) {
  size_t size;
  lua_State *L = z->L;
  const char *buff;
  lua_unlock(L);
  buff = z->reader(L, z->data, &size);
  lua_lock(L);
  if (buff == NULL || size == 0)
    return EOZ;
  z->n = size - 1;  /* discount char being returned */
  z->p = buff;
  return cast_uchar(*(z->p++));
}